

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O3

void __thiscall trng::yarn4::jump2(yarn4 *this,uint s)

{
  long lVar1;
  long lVar2;
  int32_t *piVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  int k;
  long lVar7;
  uint uVar8;
  result_type d [4];
  result_type c [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int32_t local_a8 [2];
  int32_t aiStack_a0 [2];
  int32_t local_98;
  int32_t local_94 [11];
  undefined8 local_68;
  int32_t aiStack_60 [14];
  
  aiStack_60[10] = 0;
  aiStack_60[0xb] = 0;
  aiStack_60[0xc] = 0;
  aiStack_60[0xd] = 0;
  aiStack_60[6] = 0;
  aiStack_60[7] = 0;
  aiStack_60[8] = 0;
  aiStack_60[9] = 0;
  aiStack_60[2] = 0;
  aiStack_60[3] = 0;
  aiStack_60[4] = 0;
  aiStack_60[5] = 0;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  aiStack_60[0] = 0;
  aiStack_60[1] = 0;
  local_a8 = (int32_t  [2])*(undefined8 *)(this->P).a;
  aiStack_a0 = (int32_t  [2])*(undefined8 *)((this->P).a + 2);
  local_98 = 1;
  local_94[0] = 0;
  local_94[1] = 0;
  local_94[2] = 0;
  local_94[3] = 0;
  local_94[4] = 1;
  local_94[5] = 0;
  local_94[6] = 0;
  local_94[7] = 0;
  local_94[8] = 0;
  local_94[9] = 1;
  local_94[10] = 0;
  if (s != 0) {
    uVar8 = 0;
    do {
      int_math::matrix_mult<4>
                ((int32_t (*) [16])local_a8,(int32_t (*) [16])local_a8,(int32_t (*) [16])&local_68,
                 0x7fffffff);
      if (s <= uVar8 + 1) break;
      int_math::matrix_mult<4>
                ((int32_t (*) [16])&local_68,(int32_t (*) [16])&local_68,(int32_t (*) [16])local_a8,
                 0x7fffffff);
      uVar8 = uVar8 + 2;
    } while (uVar8 < s);
  }
  local_b8 = *(undefined8 *)(this->S).r;
  uStack_b0 = *(undefined8 *)((this->S).r + 2);
  if ((s & 1) == 0) {
    piVar3 = local_a8;
    lVar5 = 0;
    do {
      lVar7 = 0;
      lVar6 = 0;
      do {
        lVar2 = ((long)*(int *)((long)&local_b8 + lVar7 * 4) * (long)piVar3[lVar7]) % 0x7fffffff;
        lVar1 = lVar2 + lVar6;
        lVar6 = lVar6 + -0x7fffffff + lVar2;
        if (lVar1 < 0x7fffffff) {
          lVar6 = lVar1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      *(int *)((long)&local_c8 + lVar5 * 4) = (int)lVar6;
      lVar5 = lVar5 + 1;
      piVar3 = piVar3 + 4;
    } while (lVar5 != 4);
  }
  else {
    puVar4 = &local_68;
    lVar5 = 0;
    do {
      lVar7 = 0;
      lVar6 = 0;
      do {
        lVar2 = ((long)*(int *)((long)&local_b8 + lVar7 * 4) *
                (long)*(int *)((long)puVar4 + lVar7 * 4)) % 0x7fffffff;
        lVar1 = lVar2 + lVar6;
        lVar6 = lVar6 + -0x7fffffff + lVar2;
        if (lVar1 < 0x7fffffff) {
          lVar6 = lVar1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      *(int *)((long)&local_c8 + lVar5 * 4) = (int)lVar6;
      lVar5 = lVar5 + 1;
      puVar4 = puVar4 + 2;
    } while (lVar5 != 4);
  }
  *(undefined8 *)(this->S).r = local_c8;
  *(undefined8 *)((this->S).r + 2) = uStack_c0;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::jump2(unsigned int s) {
    result_type b[16], c[16]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = P.a[3];
    b[4] = 1;
    b[5] = 0;
    b[6] = 0;
    b[7] = 0;
    b[8] = 0;
    b[9] = 1;
    b[10] = 0;
    b[11] = 0;
    b[12] = 0;
    b[13] = 0;
    b[14] = 1;
    b[15] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<4>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<4>(c, c, b, modulus);
    }
    const result_type r[4]{S.r[0], S.r[1], S.r[2], S.r[3]};
    result_type d[4];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<4>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<4>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
    S.r[3] = d[3];
  }